

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

int sshproxy_askappend(LogPolicy *lp,Filename *filename,_func_void_void_ptr_int *callback,void *ctx)

{
  char *pcVar1;
  char *msg;
  SshProxy *sp;
  void *ctx_local;
  _func_void_void_ptr_int *callback_local;
  Filename *filename_local;
  LogPolicy *lp_local;
  
  if (lp[-0x411].vt == (LogPolicyVtable *)0x0) {
    pcVar1 = filename_to_str(filename);
    pcVar1 = dupprintf("Log file \"%s\" already exists; logging cancelled",pcVar1);
    sshproxy_eventlog(lp,pcVar1);
    safefree(pcVar1);
    lp_local._4_4_ = 0;
  }
  else {
    lp_local._4_4_ = lp_askappend((LogPolicy *)lp[-0x411].vt,filename,callback,ctx);
  }
  return lp_local._4_4_;
}

Assistant:

static int sshproxy_askappend(LogPolicy *lp, Filename *filename,
                              void (*callback)(void *ctx, int result),
                              void *ctx)
{
    SshProxy *sp = container_of(lp, SshProxy, logpolicy);

    /*
     * If we have access to the outer LogPolicy, pass on this request
     * to the end user.
     */
    if (sp->clientlp)
        return lp_askappend(sp->clientlp, filename, callback, ctx);

    /*
     * Otherwise, fall back to the safe noninteractive assumption.
     */
    char *msg = dupprintf("Log file \"%s\" already exists; logging cancelled",
                          filename_to_str(filename));
    sshproxy_eventlog(lp, msg);
    sfree(msg);
    return 0;
}